

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_predictor_16x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar4;
  undefined1 auVar6 [16];
  
  dc_sum_64(left);
  auVar6 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])above);
  iVar1 = (CONCAT22(auVar6._2_2_ + (short)((uint)extraout_XMM0_Da >> 0x10) + auVar6._10_2_,
                    auVar6._0_2_ + (short)extraout_XMM0_Da + auVar6._8_2_) + 0x28U >> 4) * 0x3334;
  uVar5 = (undefined1)((uint)iVar1 >> 0x18);
  uVar3 = (undefined1)((uint)iVar1 >> 0x10);
  auVar6 = ZEXT416(CONCAT22(CONCAT11(uVar5,uVar5),CONCAT11(uVar3,uVar3)));
  auVar6 = pshuflw(auVar6,auVar6,0);
  uVar4 = auVar6._0_4_;
  iVar1 = 0x40;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    *(undefined4 *)dst = uVar4;
    *(undefined4 *)(dst + 4) = uVar4;
    *(undefined4 *)(dst + 8) = uVar4;
    *(undefined4 *)(dst + 0xc) = uVar4;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_16x64_sse2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m128i sum_left = dc_sum_64(left);
  __m128i sum_above = dc_sum_16_sse2(above);
  sum_above = _mm_add_epi16(sum_left, sum_above);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 40;
  sum = divide_using_multiply_shift(sum, 4, DC_MULTIPLIER_1X4);
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_16xh(&row, 64, dst, stride);
}